

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void count_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_528;
  undefined4 local_51c;
  iterator local_518;
  iterator local_500;
  difference_type local_4e8;
  undefined4 local_4dc;
  iterator local_4d8;
  iterator local_4c0;
  difference_type local_4a8;
  undefined4 local_49c;
  iterator local_498;
  iterator local_480;
  difference_type local_468;
  undefined4 local_45c;
  double local_458;
  iterator local_450;
  iterator local_438;
  difference_type local_420 [2];
  undefined4 local_410;
  int local_40c;
  iterator local_408;
  iterator local_3f0;
  difference_type local_3d8 [2];
  undefined4 local_3c8;
  bool local_3c1;
  iterator local_3c0;
  iterator local_3a8;
  difference_type local_390;
  undefined4 local_384;
  iterator local_380;
  iterator local_368;
  difference_type local_350;
  undefined4 local_344;
  iterator local_340;
  iterator local_328;
  difference_type local_310;
  undefined4 local_304;
  iterator local_300;
  iterator local_2e8;
  difference_type local_2d0;
  undefined4 local_2c4;
  iterator local_2c0;
  iterator local_2a8;
  difference_type local_290 [2];
  undefined4 local_280;
  int local_27c;
  iterator local_278;
  iterator local_260;
  difference_type local_248 [2];
  undefined4 local_238;
  int local_234;
  iterator local_230;
  iterator local_218;
  difference_type local_200 [2];
  undefined4 local_1f0;
  bool local_1e9;
  iterator local_1e8;
  iterator local_1d0;
  difference_type local_1b8 [3];
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,2);
  local_1a0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1a0,3.0);
  local_1a0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,"alpha");
  local_1a0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"bravo");
  local_1a0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"charlie");
  local_1a0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_528 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_528 = local_528 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_528);
  } while (local_528 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1e9 = true;
  local_1b8[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                           (&local_1d0,&local_1e8,&local_1e9);
  local_1f0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), true)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x55,"void count_array()",local_1b8,&local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_234 = 2;
  local_200[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                           (&local_218,&local_230,&local_234);
  local_238 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 2)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x56,"void count_array()",local_200,&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_27c = 3;
  local_248[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                           (&local_260,&local_278,&local_27c);
  local_280 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 3)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x57,"void count_array()",local_248,&local_280);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_290[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
                           (&local_2a8,&local_2c0,(char (*) [6])"alpha");
  local_2c4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), \"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x58,"void count_array()",local_290,&local_2c4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_2d0 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
                        (&local_2e8,&local_300,(wchar_t (*) [6])L"bravo");
  local_304 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), L\"bravo\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x59,"void count_array()",&local_2d0,&local_304);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_328,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_340,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_310 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
                        (&local_328,&local_340,(char16_t (*) [8])L"charlie");
  local_344 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), u\"charlie\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x5a,"void count_array()",&local_310,&local_344);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_340);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_368,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_380,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_350 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
                        (&local_368,&local_380,(char32_t (*) [6])L"delta");
  local_384 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), U\"delta\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x5b,"void count_array()",&local_350,&local_384);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_380);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_3c1 = false;
  local_390 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                        (&local_3a8,&local_3c0,&local_3c1);
  local_3c8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x5d,"void count_array()",&local_390,&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_408,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_40c = 0x2a;
  local_3d8[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                           (&local_3f0,&local_408,&local_40c);
  local_410 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 42)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x5e,"void count_array()",local_3d8,&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_438,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_450,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_458 = 42.0;
  local_420[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
                           (&local_438,&local_450,&local_458);
  local_45c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 42.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x5f,"void count_array()",local_420,&local_45c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_480,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_498,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_468 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[1]>
                        (&local_480,&local_498,(char (*) [1])0x11ddeb);
  local_49c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), \"\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x60,"void count_array()",&local_468,&local_49c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_480);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4a8 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[1]>
                        (&local_4c0,&local_4d8,(wchar_t (*) [1])0x120648);
  local_4dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), L\"\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x61,"void count_array()",&local_4a8,&local_4dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_500,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_518,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_4e8 = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[1]>
                        (&local_500,&local_518,(char16_t (*) [1])0x12065a);
  local_51c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), u\"\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x62,"void count_array()",&local_4e8,&local_51c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), true), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 2), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 3), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), "alpha"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), L"bravo"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), u"charlie"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), U"delta"), 1);

    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), false), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 42), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 42.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), ""), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), L""), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), u""), 0);
}